

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O2

void __thiscall juzzlin::SimpleLogger::Impl::flushFileIfOpen(Impl *this)

{
  char cVar1;
  ostream *poVar2;
  string local_30 [32];
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<((ostream *)m_fileStream,local_30);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_30);
    std::ostream::flush();
  }
  return;
}

Assistant:

void SimpleLogger::Impl::flushFileIfOpen()
{
    if (m_fileStream.is_open()) {
        m_fileStream << m_message.str() << std::endl;
        m_fileStream.flush();
    }
}